

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readline.c
# Opt level: O0

HIST_ENTRY * next_history(void)

{
  int iVar1;
  undefined1 local_20 [8];
  HistEvent ev;
  
  if (history_offset < history_length) {
    iVar1 = history(h,(HistEvent_conflict *)local_20,4);
    if (iVar1 == 0) {
      history_offset = history_offset + L'\x01';
      ev.str = (char *)current_history();
    }
    else {
      ev.str = (char *)0x0;
    }
  }
  else {
    ev.str = (char *)0x0;
  }
  return (HIST_ENTRY *)ev.str;
}

Assistant:

HIST_ENTRY *
next_history(void)
{
	HistEvent ev;

	if (history_offset >= history_length)
		return NULL;

	if (history(h, &ev, H_LAST) != 0)
		return NULL;

	history_offset++;
	return current_history();
}